

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void __thiscall CTestNetParams::CTestNetParams(CTestNetParams *this)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pointer puVar2;
  base_blob<256U> *pbVar3;
  bool bVar4;
  CAmount *in_R9;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_ba;
  allocator_type local_b9;
  pair<const_int,_uint256> local_b8;
  CBlock local_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = TESTNET;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar2 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  local_88.super_CBlockHeader.nVersion = -0x5bcd4efb;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xf7;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = 'J';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0x87;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0x99;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0xa5;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 'z';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 'B';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\x02';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xd0;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xee;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xb0;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x96;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x12';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 0xcc;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\b';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xd2;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0x95;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '@';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\x1f';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '|';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 'E';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xdd;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_b8._0_8_ = (ulong)(uint)local_b8.second.super_base_blob<256U>.m_data._M_elems._0_4_ << 0x20;
  std::
  map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::emplace<uint256,__0>
            ((map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)&(this->super_CChainParams).consensus.script_flag_exceptions,(uint256 *)&local_88,
             (anon_enum_32 *)&local_b8);
  (this->super_CChainParams).consensus.BIP34Height = 0x5277;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xf8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x8e;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xcd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x99;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\x12';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xd0;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\r';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '?';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\\';
  (pbVar3->m_data)._M_elems[9] = '*';
  (pbVar3->m_data)._M_elems[10] = 0x8e;
  (pbVar3->m_data)._M_elems[0xb] = '\x0f';
  (pbVar3->m_data)._M_elems[0xc] = 'P';
  (pbVar3->m_data)._M_elems[0xd] = 'A';
  (pbVar3->m_data)._M_elems[0xe] = '}';
  (pbVar3->m_data)._M_elems[0xf] = '>';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = 'A';
  (pbVar3->m_data)._M_elems[0x11] = '\\';
  (pbVar3->m_data)._M_elems[0x12] = 'u';
  (pbVar3->m_data)._M_elems[0x13] = 0xb3;
  (pbVar3->m_data)._M_elems[0x14] = 0xab;
  (pbVar3->m_data)._M_elems[0x15] = 0xe5;
  (pbVar3->m_data)._M_elems[0x16] = 0x84;
  (pbVar3->m_data)._M_elems[0x17] = '4';
  pbVar3 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = 'm';
  (pbVar3->m_data)._M_elems[0x19] = 0xa9;
  (pbVar3->m_data)._M_elems[0x1a] = 0xb3;
  (pbVar3->m_data)._M_elems[0x1b] = '#';
  *(undefined8 *)
   ((this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems + 0x1c) =
       0x8e0fd00000000;
  (this->super_CChainParams).consensus.BIP66Height = 0x50c18;
  (this->super_CChainParams).consensus.CSVHeight = 0xbc040;
  (this->super_CChainParams).consensus.SegwitHeight = 0xcbc40;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0xcc420;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[4] = 0xff;
  (pbVar3->m_data)._M_elems[5] = 0xff;
  (pbVar3->m_data)._M_elems[6] = 0xff;
  (pbVar3->m_data)._M_elems[7] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = 0xff;
  (pbVar3->m_data)._M_elems[9] = 0xff;
  (pbVar3->m_data)._M_elems[10] = 0xff;
  (pbVar3->m_data)._M_elems[0xb] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0xc] = 0xff;
  (pbVar3->m_data)._M_elems[0xd] = 0xff;
  (pbVar3->m_data)._M_elems[0xe] = 0xff;
  (pbVar3->m_data)._M_elems[0xf] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0xc] = 0xff;
  (pbVar3->m_data)._M_elems[0xd] = 0xff;
  (pbVar3->m_data)._M_elems[0xe] = 0xff;
  (pbVar3->m_data)._M_elems[0xf] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = 0xff;
  (pbVar3->m_data)._M_elems[0x11] = 0xff;
  (pbVar3->m_data)._M_elems[0x12] = 0xff;
  (pbVar3->m_data)._M_elems[0x13] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x14] = 0xff;
  (pbVar3->m_data)._M_elems[0x15] = 0xff;
  (pbVar3->m_data)._M_elems[0x16] = 0xff;
  (pbVar3->m_data)._M_elems[0x17] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = 0xff;
  (pbVar3->m_data)._M_elems[0x19] = 0xff;
  (pbVar3->m_data)._M_elems[0x1a] = 0xff;
  (pbVar3->m_data)._M_elems[0x1b] = 0xff;
  pbVar3 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = true;
  (this->super_CChainParams).consensus.enforce_BIP94 = false;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x5e8;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = 0x60835f80;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x61131300;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xa9;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\x1f';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xb6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xe8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'k';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\x16';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0x95;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0x96;
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = ' ';
  (pbVar3->m_data)._M_elems[9] = '\x0f';
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  pbVar3 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xad;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x90;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xfc;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\t';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xda;
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\x11';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 'x';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 'W';
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '?';
  (pbVar3->m_data)._M_elems[9] = '\x1f';
  (pbVar3->m_data)._M_elems[10] = ' ';
  (pbVar3->m_data)._M_elems[0xb] = 0xf9;
  (pbVar3->m_data)._M_elems[0xc] = 0xce;
  (pbVar3->m_data)._M_elems[0xd] = 'Z';
  (pbVar3->m_data)._M_elems[0xe] = 199;
  (pbVar3->m_data)._M_elems[0xf] = 0xe8;
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\b';
  (pbVar3->m_data)._M_elems[0x11] = 'c';
  (pbVar3->m_data)._M_elems[0x12] = '8';
  (pbVar3->m_data)._M_elems[0x13] = 0x9f;
  (pbVar3->m_data)._M_elems[0x14] = 'l';
  (pbVar3->m_data)._M_elems[0x15] = 0xa6;
  (pbVar3->m_data)._M_elems[0x16] = 0xb1;
  (pbVar3->m_data)._M_elems[0x17] = 'e';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x18] = '\x04';
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  pbVar3 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0x709110b;
  (this->super_CChainParams).nDefaultPort = 0x479d;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  (this->super_CChainParams).m_assumed_blockchain_size = 0x5d;
  (this->super_CChainParams).m_assumed_chain_state_size = 0x13;
  local_b8.first = 0x2a05f200;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  CreateGenesisBlock(&local_88,0x4d49e5da,0x18aea41a,0x1d00ffff,(int32_t)&local_b8,in_R9);
  this_00 = &(this->super_CChainParams).genesis;
  CBlock::operator=(this_00,&local_88);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_88.vtx);
  CBlockHeader::GetHash((uint256 *)&local_88,&this_00->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT44(local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _16_4_,local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                       _M_elems._12_4_);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT44(local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _24_4_,local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                       _M_elems._20_4_);
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT44(local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _0_4_,local_88.super_CBlockHeader.nVersion);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT44(local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                _8_4_,local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                      _M_elems._4_4_);
  local_88.super_CBlockHeader.nVersion = -0x2880b6bd;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xf8;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '&';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = 0x95;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 'q';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\b';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xf4;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = 0xa3;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\x0f';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xd9;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 0xce;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0xc3;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0xae;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xba;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 'y';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x97;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = ' ';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0x84;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xe9;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\x0e';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 0xad;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\x01';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0xea;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '3';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\t';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  bVar4 = ::operator==((base_blob<256U> *)this,(base_blob<256U> *)&local_88);
  if (!bVar4) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x102,"CTestNetParams::CTestNetParams()");
  }
  local_88.super_CBlockHeader.nVersion = -0x2125cc5;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '{';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\x12';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xb2;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 'z';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 199;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = ',';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '>';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 'g';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'v';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0x8f;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 'a';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\x7f';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = 200;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\x1b';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xc3;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = 0x88;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0x8a;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = 'Q';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '2';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = ':';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 0x9f;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 0xb8;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0xaa;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 'K';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\x1e';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '^';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = 'J';
  bVar4 = ::operator==(&(this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                        super_base_blob<256U>,(base_blob<256U> *)&local_88);
  if (!bVar4) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x103,"CTestNetParams::CTestNetParams()");
  }
  puVar2 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[39]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [39])"testnet-seed.bitcoin.jonasschnelli.ch.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [25])"seed.tbtc.petertodd.net.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[35]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [35])"seed.testnet.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[26]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [26])"testnet-seed.bluematt.me.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [29])"seed.testnet.achownodes.xyz.");
  local_b8.first._0_1_ = 0x6f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,1,
             (value_type_conflict *)&local_b8,&local_b9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  local_b8.first._0_1_ = 0xc4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,1,
             (value_type_conflict *)&local_b8,&local_b9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  local_b8.first._0_1_ = 0xef;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,1,
             (value_type_conflict *)&local_b8,&local_b9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  local_88.super_CBlockHeader.nVersion = -0x3078cafc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),&local_88,
             &local_88.super_CBlockHeader.hashPrevBlock);
  local_88.super_CBlockHeader.nVersion = -0x6b7ccafc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4),&local_88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->super_CChainParams).bech32_hrp,"tb");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,chainparams_seed_test,
             "\"\x02",(allocator_type *)&local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->super_CChainParams).vFixedSeeds,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0xc] = 0x9c;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0xd] = 'U';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0xe] = 'l';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0xf] = 'U';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf3;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x11] = 0xe2;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x12] = 0xfc;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x13] = '5';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x14] = '<';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x15] = 'L';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x16] = 0x90;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x17] = 'c';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x18] = 0xa7;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x19] = 'l';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1a] = 0x93;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '*';
  local_b8.first = 0x222;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0] = 'p';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[1] = 0xcb;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[2] = 'j';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[3] = 0xf7;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[4] = 0xeb;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[5] = 0xbc;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[6] = 0xb1;
  local_b8.second.super_base_blob<256U>.m_data._M_elems[7] = '1';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[8] = ']';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[9] = '4';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[10] = '\x14';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\x02';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_b8.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  __l._M_len = 1;
  __l._M_array = &local_b8;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             &local_88,__l,(less<int> *)&local_b9,&local_ba);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&(this->super_CChainParams).checkpointData,
              (_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&local_88);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&local_88);
  local_88.super_CBlockHeader.nVersion = 2500000;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = 0xe7;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\x1b';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\a';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = 0xb8;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = 0x8d;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = 0xa6;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '<';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = 'l';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = 0xee;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = 'A';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = 0x8f;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = 0x81;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = 0xcd;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '(';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = 0x91;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = 0xcd;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\x7f';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = 0xe3;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '4';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = 'R';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '4';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = 'R';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = 'y';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = 0x89;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = 'G';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = 0x8e;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf6;
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\t';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = 'I';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = 'X';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = 'A';
  local_88.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xf8;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = 'H';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = 'y';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = 0xf6;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\x03';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = 'o';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = ' ';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = 's';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\x1d';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '#';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = 0xf9;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = 0xcd;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = 0xa2;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = 0xeb;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = 0xea;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = 0xa2;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = 'H';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = 0xd3;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = 'r';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '%';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '%';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = 0xae;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = 'h';
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xa1;
  local_88.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xa9;
  local_88.super_CBlockHeader.nTime = 0xbcb68c03;
  local_88.super_CBlockHeader.nBits._0_1_ = 0x93;
  local_88.super_CBlockHeader._73_4_ = 0;
  local_88.super_CBlockHeader.nNonce._1_3_ = 0;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,&local_88);
  (this->super_CChainParams).chainTxData.nTime = 0x66bc409d;
  (this->super_CChainParams).chainTxData.tx_count = 0xb33631a;
  (this->super_CChainParams).chainTxData.dTxRate = 3.265051477698455;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNetParams() {
        m_chain_type = ChainType::TESTNET;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000dd30457c001f4095d208cc1296b0eed002427aa599874af7a432b105"}, SCRIPT_VERIFY_NONE);
        consensus.BIP34Height = 21111;
        consensus.BIP34Hash = uint256{"0000000023b3a96d3484e5abb3755c413e7d41500f8e2a5c3f0dd01299cd8ef8"};
        consensus.BIP65Height = 581885; // 00000000007f6655f22f98e72ed80d8b06dc761d5da09df0fa1dc4be4f861eb6
        consensus.BIP66Height = 330776; // 000000002104c8c45e99a8853285a3b592602a3ccde2b832481da85e9e4ba182
        consensus.CSVHeight = 770112; // 00000000025e930139bac5c6c31a403776da130831ab85be56578f3fa75369bb
        consensus.SegwitHeight = 834624; // 00000000002b980fcd729daaa248fd9316a5200e9b367f4ff2c42453e84201ca
        consensus.MinBIP9WarningHeight = 836640; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000000000f209695166be8b61fa9"};
        consensus.defaultAssumeValid = uint256{"000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad"}; // 2873500

        pchMessageStart[0] = 0x0b;
        pchMessageStart[1] = 0x11;
        pchMessageStart[2] = 0x09;
        pchMessageStart[3] = 0x07;
        nDefaultPort = 18333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 93;
        m_assumed_chain_state_size = 19;

        genesis = CreateGenesisBlock(1296688602, 414098458, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("testnet-seed.bitcoin.jonasschnelli.ch.");
        vSeeds.emplace_back("seed.tbtc.petertodd.net.");
        vSeeds.emplace_back("seed.testnet.bitcoin.sprovoost.nl.");
        vSeeds.emplace_back("testnet-seed.bluematt.me."); // Just a static list of stable node(s), only supports x9
        vSeeds.emplace_back("seed.testnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_test), std::end(chainparams_seed_test));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {546, uint256{"000000002a936ca763904c3c35fce2f3556c559c0214345d31b1bcebf76acb70"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 2'500'000,
                .hash_serialized = AssumeutxoHash{uint256{"f841584909f68e47897952345234e37fcd9128cd818f41ee6c3ca68db8071be7"}},
                .m_chain_tx_count = 66484552,
                .blockhash = consteval_ctor(uint256{"0000000000000093bcb68c03a9a168ae252572d348a2eaeba2cdf9231d73206f"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad
            .nTime    = 1723613341,
            .tx_count = 187917082,
            .dTxRate  = 3.265051477698455,
        };
    }